

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

bool __thiscall cmListFileParser::ParseFunction(cmListFileParser *this,char *name,long line)

{
  cmMessenger *this_00;
  cmListFileLexer_Token *pcVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  bool bVar5;
  string local_7a0;
  cmListFileBacktrace local_780;
  undefined1 local_770 [8];
  cmListFileBacktrace lfbt;
  cmListFileContext lfc;
  ostringstream error;
  string local_5a0;
  ostringstream local_580 [8];
  ostringstream error_3;
  long local_408;
  unsigned_long parenDepth;
  unsigned_long lastLine;
  ostringstream local_3d8 [8];
  ostringstream error_2;
  string local_260;
  ostringstream local_240 [8];
  ostringstream error_1;
  cmListFileLexer_Token *token;
  allocator<char> local_a9;
  string local_a8;
  cmListFileFunction local_88;
  long local_28;
  long line_local;
  char *name_local;
  cmListFileParser *this_local;
  
  local_88.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super_cmCommandContext.Line = 0;
  local_88.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super_cmCommandContext.Name.Original.field_2._M_allocated_capacity = 0;
  local_88.super_cmCommandContext.Name.Original.field_2._8_8_ = 0;
  local_88.super_cmCommandContext.Name.Original._M_dataplus = (_Alloc_hider)0x0;
  local_88.super_cmCommandContext.Name.Original._1_7_ = 0;
  local_88.super_cmCommandContext.Name.Original._M_string_length = 0;
  local_88.super_cmCommandContext.Name.Lower.field_2._M_allocated_capacity = 0;
  local_88.super_cmCommandContext.Name.Lower.field_2._8_8_ = 0;
  local_88.super_cmCommandContext.Name.Lower._M_dataplus = (_Alloc_hider)0x0;
  local_88.super_cmCommandContext.Name.Lower._1_7_ = 0;
  local_88.super_cmCommandContext.Name.Lower._M_string_length = 0;
  local_28 = line;
  line_local = (long)name;
  name_local = (char *)this;
  cmListFileFunction::cmListFileFunction(&local_88);
  cmListFileFunction::operator=(&this->Function,&local_88);
  cmListFileFunction::~cmListFileFunction(&local_88);
  lVar4 = line_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,(char *)lVar4,&local_a9);
  cmCommandContext::cmCommandName::operator=((cmCommandName *)&this->Function,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  (this->Function).super_cmCommandContext.Line = local_28;
  do {
    pcVar1 = cmListFileLexer_Scan(this->Lexer);
    bVar5 = false;
    if (pcVar1 != (cmListFileLexer_Token *)0x0) {
      bVar5 = pcVar1->type == cmListFileLexer_Token_Space;
    }
  } while (bVar5);
  if (pcVar1 == (cmListFileLexer_Token *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_240);
    poVar2 = std::operator<<((ostream *)local_240,"Unexpected end of file.\n");
    std::operator<<(poVar2,"Parse error.  Function missing opening \"(\".");
    std::__cxx11::ostringstream::str();
    IssueError(this,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_240);
  }
  else if (pcVar1->type == cmListFileLexer_Token_ParenLeft) {
    local_408 = 0;
    this->Separation = SeparationOkay;
    do {
      while( true ) {
        while( true ) {
          lVar4 = cmListFileLexer_GetCurrentLine(this->Lexer);
          pcVar1 = cmListFileLexer_Scan(this->Lexer);
          if (pcVar1 == (cmListFileLexer_Token *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&lfc.Line);
            cmListFileContext::cmListFileContext
                      ((cmListFileContext *)
                       &lfbt.TopEntry.
                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            std::__cxx11::string::operator=
                      ((string *)(lfc.Name.field_2._M_local_buf + 8),this->FileName);
            lfc.FilePath.field_2._8_8_ = lVar4;
            cmListFileBacktrace::cmListFileBacktrace
                      ((cmListFileBacktrace *)local_770,&this->Backtrace);
            cmListFileBacktrace::Push(&local_780,(cmListFileContext *)local_770);
            cmListFileBacktrace::operator=((cmListFileBacktrace *)local_770,&local_780);
            cmListFileBacktrace::~cmListFileBacktrace(&local_780);
            poVar2 = std::operator<<((ostream *)&lfc.Line,
                                     "Parse error.  Function missing ending \")\".  ");
            std::operator<<(poVar2,"End of file reached.");
            this_00 = this->Messenger;
            std::__cxx11::ostringstream::str();
            cmMessenger::IssueMessage
                      (this_00,FATAL_ERROR,&local_7a0,(cmListFileBacktrace *)local_770);
            std::__cxx11::string::~string((string *)&local_7a0);
            this_local._7_1_ = 0;
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_770);
            cmListFileContext::~cmListFileContext
                      ((cmListFileContext *)
                       &lfbt.TopEntry.
                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&lfc.Line);
            goto LAB_004e3267;
          }
          if ((pcVar1->type != cmListFileLexer_Token_Space) &&
             (pcVar1->type != cmListFileLexer_Token_Newline)) break;
          this->Separation = SeparationOkay;
        }
        if (pcVar1->type == cmListFileLexer_Token_ParenLeft) break;
        if (pcVar1->type == cmListFileLexer_Token_ParenRight) {
          if (local_408 == 0) {
            this_local._7_1_ = 1;
            goto LAB_004e3267;
          }
          local_408 = local_408 + -1;
          this->Separation = SeparationOkay;
          bVar5 = AddArgument(this,pcVar1,Unquoted);
          if (!bVar5) {
            this_local._7_1_ = 0;
            goto LAB_004e3267;
          }
          this->Separation = SeparationWarning;
        }
        else if ((pcVar1->type == cmListFileLexer_Token_Identifier) ||
                (pcVar1->type == cmListFileLexer_Token_ArgumentUnquoted)) {
          bVar5 = AddArgument(this,pcVar1,Unquoted);
          if (!bVar5) {
            this_local._7_1_ = 0;
            goto LAB_004e3267;
          }
          this->Separation = SeparationWarning;
        }
        else if (pcVar1->type == cmListFileLexer_Token_ArgumentQuoted) {
          bVar5 = AddArgument(this,pcVar1,Quoted);
          if (!bVar5) {
            this_local._7_1_ = 0;
            goto LAB_004e3267;
          }
          this->Separation = SeparationWarning;
        }
        else if (pcVar1->type == cmListFileLexer_Token_ArgumentBracket) {
          bVar5 = AddArgument(this,pcVar1,Bracket);
          if (!bVar5) {
            this_local._7_1_ = 0;
            goto LAB_004e3267;
          }
          this->Separation = SeparationError;
        }
        else {
          if (pcVar1->type != cmListFileLexer_Token_CommentBracket) {
            std::__cxx11::ostringstream::ostringstream(local_580);
            poVar2 = std::operator<<((ostream *)local_580,
                                     "Parse error.  Function missing ending \")\".  ");
            poVar2 = std::operator<<(poVar2,"Instead found ");
            pcVar3 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar1->type);
            poVar2 = std::operator<<(poVar2,pcVar3);
            poVar2 = std::operator<<(poVar2," with text \"");
            poVar2 = std::operator<<(poVar2,pcVar1->text);
            std::operator<<(poVar2,"\".");
            std::__cxx11::ostringstream::str();
            IssueError(this,&local_5a0);
            std::__cxx11::string::~string((string *)&local_5a0);
            this_local._7_1_ = 0;
            std::__cxx11::ostringstream::~ostringstream(local_580);
            goto LAB_004e3267;
          }
          this->Separation = SeparationError;
        }
      }
      local_408 = local_408 + 1;
      this->Separation = SeparationOkay;
      bVar5 = AddArgument(this,pcVar1,Unquoted);
    } while (bVar5);
    this_local._7_1_ = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_3d8);
    poVar2 = std::operator<<((ostream *)local_3d8,"Parse error.  Expected \"(\", got ");
    pcVar3 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar1->type);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2," with text \"");
    poVar2 = std::operator<<(poVar2,pcVar1->text);
    std::operator<<(poVar2,"\".");
    std::__cxx11::ostringstream::str();
    IssueError(this,(string *)&lastLine);
    std::__cxx11::string::~string((string *)&lastLine);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_3d8);
  }
LAB_004e3267:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmListFileParser::ParseFunction(const char* name, long line)
{
  // Ininitialize a new function call.
  this->Function = cmListFileFunction();
  this->Function.Name = name;
  this->Function.Line = line;

  // Command name has already been parsed.  Read the left paren.
  cmListFileLexer_Token* token;
  while ((token = cmListFileLexer_Scan(this->Lexer)) &&
         token->type == cmListFileLexer_Token_Space) {
  }
  if (!token) {
    std::ostringstream error;
    /* clang-format off */
    error << "Unexpected end of file.\n"
          << "Parse error.  Function missing opening \"(\".";
    /* clang-format on */
    this->IssueError(error.str());
    return false;
  }
  if (token->type != cmListFileLexer_Token_ParenLeft) {
    std::ostringstream error;
    error << "Parse error.  Expected \"(\", got "
          << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
          << " with text \"" << token->text << "\".";
    this->IssueError(error.str());
    return false;
  }

  // Arguments.
  unsigned long lastLine;
  unsigned long parenDepth = 0;
  this->Separation = SeparationOkay;
  while (
    (static_cast<void>(lastLine = cmListFileLexer_GetCurrentLine(this->Lexer)),
     token = cmListFileLexer_Scan(this->Lexer))) {
    if (token->type == cmListFileLexer_Token_Space ||
        token->type == cmListFileLexer_Token_Newline) {
      this->Separation = SeparationOkay;
      continue;
    }
    if (token->type == cmListFileLexer_Token_ParenLeft) {
      parenDepth++;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
    } else if (token->type == cmListFileLexer_Token_ParenRight) {
      if (parenDepth == 0) {
        return true;
      }
      parenDepth--;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_Identifier ||
               token->type == cmListFileLexer_Token_ArgumentUnquoted) {
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentQuoted) {
      if (!this->AddArgument(token, cmListFileArgument::Quoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentBracket) {
      if (!this->AddArgument(token, cmListFileArgument::Bracket)) {
        return false;
      }
      this->Separation = SeparationError;
    } else if (token->type == cmListFileLexer_Token_CommentBracket) {
      this->Separation = SeparationError;
    } else {
      // Error.
      std::ostringstream error;
      error << "Parse error.  Function missing ending \")\".  "
            << "Instead found "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      this->IssueError(error.str());
      return false;
    }
  }

  std::ostringstream error;
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = lastLine;
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);
  error << "Parse error.  Function missing ending \")\".  "
        << "End of file reached.";
  this->Messenger->IssueMessage(MessageType::FATAL_ERROR, error.str(), lfbt);
  return false;
}